

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O2

void jas_image_clearfmts(void)

{
  char **ppcVar1;
  int i;
  long lVar2;
  
  ppcVar1 = &jas_image_fmtinfos[0].desc;
  for (lVar2 = 0; lVar2 < jas_image_numfmts; lVar2 = lVar2 + 1) {
    if (ppcVar1[-2] != (char *)0x0) {
      jas_free(ppcVar1[-2]);
      ppcVar1[-2] = (char *)0x0;
    }
    if (ppcVar1[-1] != (char *)0x0) {
      jas_free(ppcVar1[-1]);
      ppcVar1[-1] = (char *)0x0;
    }
    if (*ppcVar1 != (char *)0x0) {
      jas_free(*ppcVar1);
      *ppcVar1 = (char *)0x0;
    }
    ppcVar1 = ppcVar1 + 7;
  }
  jas_image_numfmts = 0;
  return;
}

Assistant:

void jas_image_clearfmts()
{
	int i;
	jas_image_fmtinfo_t *fmtinfo;
	for (i = 0; i < jas_image_numfmts; ++i) {
		fmtinfo = &jas_image_fmtinfos[i];
		if (fmtinfo->name) {
			jas_free(fmtinfo->name);
			fmtinfo->name = 0;
		}
		if (fmtinfo->ext) {
			jas_free(fmtinfo->ext);
			fmtinfo->ext = 0;
		}
		if (fmtinfo->desc) {
			jas_free(fmtinfo->desc);
			fmtinfo->desc = 0;
		}
	}
	jas_image_numfmts = 0;
}